

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O2

void __thiscall
duckdb::DynamicTableFilterSet::PushFilter
          (DynamicTableFilterSet *this,PhysicalOperator *op,idx_t column_index,
          unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *filter)

{
  idx_t __p;
  iterator iVar1;
  __uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *this_00;
  TableFilterSet *this_01;
  templated_unique_single_t filter_set;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_60;
  optional_ptr<duckdb::TableFilterSet,_true> local_58;
  ColumnIndex local_50;
  key_type local_30;
  
  ::std::mutex::lock(&this->lock);
  local_50.index = (idx_t)op;
  iVar1 = ::std::
          _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->filters)._M_h,(key_type *)&local_50);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    make_uniq<duckdb::TableFilterSet>();
    local_58.ptr = (TableFilterSet *)local_50.index;
    local_30._M_data = op;
    this_00 = (__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
               *)::std::__detail::
                 _Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->filters,&local_30);
    __p = local_50.index;
    local_50.index = 0;
    ::std::__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
    reset(this_00,(pointer)__p);
    ::std::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
    ~unique_ptr((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *)
                &local_50);
  }
  else {
    local_58.ptr = *(TableFilterSet **)
                    ((long)iVar1.
                           super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_true>
                           ._M_cur + 0x10);
  }
  this_01 = optional_ptr<duckdb::TableFilterSet,_true>::operator->(&local_58);
  local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_head_impl =
       (filter->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
       _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
       .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
  (filter->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)._M_t.
  super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
  super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = (TableFilter *)0x0;
  local_50.index = column_index;
  TableFilterSet::PushFilter
            (this_01,&local_50,
             (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
             &local_60);
  if (local_60._M_head_impl != (TableFilter *)0x0) {
    (*(local_60._M_head_impl)->_vptr_TableFilter[1])();
  }
  local_60._M_head_impl = (TableFilter *)0x0;
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
            (&local_50.child_indexes.
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void DynamicTableFilterSet::PushFilter(const PhysicalOperator &op, idx_t column_index, unique_ptr<TableFilter> filter) {
	lock_guard<mutex> l(lock);
	auto entry = filters.find(op);
	optional_ptr<TableFilterSet> filter_ptr;
	if (entry == filters.end()) {
		auto filter_set = make_uniq<TableFilterSet>();
		filter_ptr = filter_set.get();
		filters[op] = std::move(filter_set);
	} else {
		filter_ptr = entry->second.get();
	}
	filter_ptr->PushFilter(ColumnIndex(column_index), std::move(filter));
}